

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srtStreamReader.cpp
# Opt level: O3

int __thiscall SRTStreamReader::readPacket(SRTStreamReader *this,AVPacket *avPacket)

{
  int iVar1;
  undefined8 in_RAX;
  uint8_t *puVar2;
  uint32_t renderedLen;
  uint local_14;
  
  local_14 = (uint)((ulong)in_RAX >> 0x20);
  iVar1 = (*(this->m_dstSubCodec->super_BaseAbstractStreamReader)._vptr_BaseAbstractStreamReader[6])
                    ();
  if (iVar1 == 1) {
    puVar2 = renderNextMessage(this,&local_14);
    if (puVar2 == (uint8_t *)0x0) {
      iVar1 = 1;
    }
    else {
      (*(this->m_dstSubCodec->super_BaseAbstractStreamReader)._vptr_BaseAbstractStreamReader[4])
                (this->m_dstSubCodec,puVar2 + -0x8000,(ulong)local_14,
                 (ulong)(byte)((this->m_sourceText).c.
                               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                               (this->m_sourceText).c.
                               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_cur & this->m_lastBlock))
      ;
      iVar1 = (*(this->m_dstSubCodec->super_BaseAbstractStreamReader)._vptr_BaseAbstractStreamReader
                [6])(this->m_dstSubCodec,avPacket);
    }
  }
  return iVar1;
}

Assistant:

int SRTStreamReader::readPacket(AVPacket& avPacket)
{
    const int rez = m_dstSubCodec->readPacket(avPacket);
    if (rez == NEED_MORE_DATA)
    {
        uint32_t renderedLen;
        uint8_t* renderedBuffer = renderNextMessage(renderedLen);
        if (renderedBuffer)
        {
            m_dstSubCodec->setBuffer(renderedBuffer - MAX_AV_PACKET_SIZE, renderedLen,
                                     m_lastBlock && m_sourceText.empty());
            return m_dstSubCodec->readPacket(avPacket);
        }
        return NEED_MORE_DATA;
    }
    return rez;
}